

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynom.h
# Opt level: O0

void __thiscall Polynom<Complex>::Polynom(Polynom<Complex> *this,Complex *f)

{
  Complex *pCVar1;
  Complex *in_RDI;
  uint in_stack_00000008;
  uint in_stack_0000000c;
  Matrix<Complex> *in_stack_00000010;
  Matrix<Complex> *in_stack_ffffffffffffffb8;
  MatrixRow<Complex_&> local_18 [3];
  
  Matrix<Complex>::Matrix(in_stack_00000010,in_stack_0000000c,in_stack_00000008);
  local_18[0].arr = (Complex *)Matrix<Complex>::operator[](in_stack_ffffffffffffffb8,0);
  pCVar1 = Matrix<Complex>::MatrixRow<Complex_&>::operator[](local_18,0);
  Complex::operator=(in_RDI,pCVar1);
  return;
}

Assistant:

explicit Polynom(const Field &f): m(1, 1)
    {
        m[0][0] = f;
    }